

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf.cxx
# Opt level: O2

void __thiscall
xray_re::xr_ogf::bone_motion_io::insert_key(bone_motion_io *this,float time,ogf_key_qr *value)

{
  dvector3 r;
  dquaternion q;
  dmatrix xform;
  anon_union_24_2_77b31271_for__vector3<double>_1 local_d0;
  _quaternion<double> local_b8;
  _matrix<double> local_98;
  
  ogf_key_qr::dequantize<double>(value,&local_b8);
  _matrix<double>::rotation(&local_98,&local_b8);
  _matrix<double>::get_xyz_i(&local_98,(_vector3<double> *)&local_d0.field_0);
  xr_envelope::insert_key
            ((this->super_xr_bone_motion).m_envelopes[4],time,(float)local_d0.field_0.x);
  xr_envelope::insert_key
            ((this->super_xr_bone_motion).m_envelopes[3],time,(float)local_d0.field_0.y);
  xr_envelope::insert_key
            ((this->super_xr_bone_motion).m_envelopes[5],time,(float)local_d0.field_0.z);
  return;
}

Assistant:

void xr_ogf::bone_motion_io::insert_key(float time, const ogf_key_qr* value)
{
	dquaternion q;
	value->dequantize(q);
	dmatrix xform;
	xform.rotation(q);
	dvector3 r;
	xform.get_xyz_i(r);
	m_envelopes[4]->insert_key(time, float(r.x));
	m_envelopes[3]->insert_key(time, float(r.y));
	m_envelopes[5]->insert_key(time, float(r.z));
}